

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,Filters filters)

{
  storage_type *in_RCX;
  uint in_EDX;
  undefined4 in_register_00000034;
  QDebug *dbg;
  Stream *pSVar1;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QByteArrayView ba_02;
  QByteArrayView ba_03;
  QByteArrayView ba_04;
  QByteArrayView ba_05;
  QByteArrayView ba_06;
  QByteArrayView ba_07;
  QByteArrayView ba_08;
  QByteArrayView ba_09;
  QByteArrayView ba_10;
  QByteArrayView ba_11;
  QByteArrayView ba_12;
  QByteArrayView ba_13;
  QByteArrayView ba_14;
  QByteArrayView ba_15;
  QDebugStateSaver save;
  QString local_88;
  QArrayDataPointer<QString> local_68;
  QDebugStateSaver local_50;
  QString local_48;
  long local_28;
  
  dbg = (QDebug *)
        CONCAT44(in_register_00000034,
                 filters.super_QFlagsStorageHelper<QDir::Filter,_4>.
                 super_QFlagsStorage<QDir::Filter>.i);
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&local_50,dbg);
  QDebug::resetFormat(dbg);
  local_68.d = (Data *)0x0;
  local_68.ptr = (QString *)0x0;
  local_68.size = 0;
  if (in_EDX == 0xffffffff) {
    ba_14.m_data = in_RCX;
    ba_14.m_size = (qsizetype)"NoFilter";
    QString::fromLatin1(&local_48,(QString *)0x8,ba_14);
    local_88.d.d = local_48.d.d;
    local_88.d.ptr = local_48.d.ptr;
    local_88.d.size = local_48.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
    QList<QString>::end((QList<QString> *)&local_68);
  }
  else {
    if ((in_EDX & 1) != 0) {
      ba.m_data = in_RCX;
      ba.m_size = (qsizetype)"Dirs";
      QString::fromLatin1(&local_48,(QString *)0x4,ba);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 10 & 1) != 0) {
      ba_00.m_data = in_RCX;
      ba_00.m_size = (qsizetype)"AllDirs";
      QString::fromLatin1(&local_48,(QString *)&DAT_00000007,ba_00);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 2) != 0) {
      ba_01.m_data = in_RCX;
      ba_01.m_size = (qsizetype)"Files";
      QString::fromLatin1(&local_48,(QString *)0x5,ba_01);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 4) != 0) {
      ba_02.m_data = in_RCX;
      ba_02.m_size = (qsizetype)"Drives";
      QString::fromLatin1(&local_48,(QString *)0x6,ba_02);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 8) != 0) {
      ba_03.m_data = in_RCX;
      ba_03.m_size = (qsizetype)"NoSymLinks";
      QString::fromLatin1(&local_48,(QString *)0xa,ba_03);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 0xd & 1) != 0) {
      ba_04.m_data = in_RCX;
      ba_04.m_size = (qsizetype)"NoDot";
      QString::fromLatin1(&local_48,(QString *)0x5,ba_04);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 0xe & 1) != 0) {
      ba_05.m_data = in_RCX;
      ba_05.m_size = (qsizetype)"NoDotDot";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_05);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((~in_EDX & 7) == 0) {
      ba_06.m_data = in_RCX;
      ba_06.m_size = (qsizetype)"AllEntries";
      QString::fromLatin1(&local_48,(QString *)0xa,ba_06);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 0x10) != 0) {
      ba_07.m_data = in_RCX;
      ba_07.m_size = (qsizetype)"Readable";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_07);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 0x20) != 0) {
      ba_08.m_data = in_RCX;
      ba_08.m_size = (qsizetype)"Writable";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_08);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX & 0x40) != 0) {
      ba_09.m_data = in_RCX;
      ba_09.m_size = (qsizetype)"Executable";
      QString::fromLatin1(&local_48,(QString *)0xa,ba_09);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((char)in_EDX < '\0') {
      ba_10.m_data = in_RCX;
      ba_10.m_size = (qsizetype)"Modified";
      QString::fromLatin1(&local_48,(QString *)0x8,ba_10);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 8 & 1) != 0) {
      ba_11.m_data = in_RCX;
      ba_11.m_size = (qsizetype)"Hidden";
      QString::fromLatin1(&local_48,(QString *)0x6,ba_11);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 9 & 1) != 0) {
      ba_12.m_data = in_RCX;
      ba_12.m_size = (qsizetype)"System";
      QString::fromLatin1(&local_48,(QString *)0x6,ba_12);
      local_88.d.d = local_48.d.d;
      local_88.d.ptr = local_48.d.ptr;
      local_88.d.size = local_48.d.size;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
      QList<QString>::end((QList<QString> *)&local_68);
      if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    if ((in_EDX >> 0xb & 1) == 0) goto LAB_00228c3d;
    ba_13.m_data = in_RCX;
    ba_13.m_size = (qsizetype)"CaseSensitive";
    QString::fromLatin1(&local_48,(QString *)0xd,ba_13);
    local_88.d.d = local_48.d.d;
    local_88.d.ptr = local_48.d.ptr;
    local_88.d.size = local_48.d.size;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_68,local_68.size,&local_88);
    QList<QString>::end((QList<QString> *)&local_68);
  }
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_00228c3d:
  pSVar1 = dbg->stream;
  pSVar1->noQuotes = true;
  ba_15.m_data = in_RCX;
  ba_15.m_size = (qsizetype)"QDir::Filters(";
  QString::fromUtf8(&local_48,(QString *)0xe,ba_15);
  QTextStream::operator<<(&pSVar1->ts,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (dbg->stream->space == true) {
    QTextStream::operator<<(&dbg->stream->ts,' ');
  }
  local_88.d.d = (Data *)CONCAT62(local_88.d.d._2_6_,0x7c);
  QtPrivate::QStringList_join(&local_48,(QStringList *)&local_68,(QChar *)&local_88,1);
  if ((QChar *)local_48.d.ptr == (QChar *)0x0) {
    local_48.d.ptr = &QString::_empty;
  }
  QDebug::putString(dbg,(QChar *)local_48.d.ptr,local_48.d.size);
  pSVar1 = dbg->stream;
  if (pSVar1->space == true) {
    QTextStream::operator<<(&pSVar1->ts,' ');
    pSVar1 = dbg->stream;
  }
  QTextStream::operator<<(&pSVar1->ts,')');
  if (dbg->stream->space == true) {
    QTextStream::operator<<(&dbg->stream->ts,' ');
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pSVar1 = dbg->stream;
  dbg->stream = (Stream *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar1;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_68);
  QDebugStateSaver::~QDebugStateSaver(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, QDir::Filters filters)
{
    QDebugStateSaver save(debug);
    debug.resetFormat();
    QStringList flags;
    if (filters == QDir::NoFilter) {
        flags << "NoFilter"_L1;
    } else {
        if (filters & QDir::Dirs) flags << "Dirs"_L1;
        if (filters & QDir::AllDirs) flags << "AllDirs"_L1;
        if (filters & QDir::Files) flags << "Files"_L1;
        if (filters & QDir::Drives) flags << "Drives"_L1;
        if (filters & QDir::NoSymLinks) flags << "NoSymLinks"_L1;
        if (filters & QDir::NoDot) flags << "NoDot"_L1;
        if (filters & QDir::NoDotDot) flags << "NoDotDot"_L1;
        if ((filters & QDir::AllEntries) == QDir::AllEntries) flags << "AllEntries"_L1;
        if (filters & QDir::Readable) flags << "Readable"_L1;
        if (filters & QDir::Writable) flags << "Writable"_L1;
        if (filters & QDir::Executable) flags << "Executable"_L1;
        if (filters & QDir::Modified) flags << "Modified"_L1;
        if (filters & QDir::Hidden) flags << "Hidden"_L1;
        if (filters & QDir::System) flags << "System"_L1;
        if (filters & QDir::CaseSensitive) flags << "CaseSensitive"_L1;
    }
    debug.noquote() << "QDir::Filters(" << flags.join(u'|') << ')';
    return debug;
}